

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pbVar1;
  size_type *psVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  uint uVar11;
  _Alloc_hider _Var12;
  size_type sVar13;
  bool bVar14;
  size_t tiledata_size;
  size_t tiles_x;
  size_t tiles_y;
  int iVar15;
  pointer *ppbVar16;
  ulong uVar17;
  ostream *os;
  long lVar18;
  undefined1 local_a78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a58;
  pointer local_a48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  size_type local_9d8;
  pointer local_9d0;
  _Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
  local_9c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_998;
  uint local_97c;
  string name;
  Image img;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  imageArg;
  ofstream osfile;
  iterator iStack_820;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818 [14];
  ios_base local_730 [272];
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outputArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  SwitchArg mapSwitch;
  SwitchArg rleSwitch;
  StdOutput std_output;
  SwitchArg size8x16Switch;
  CmdLine cmd;
  SwitchArg spriteSwitch;
  ValueArg<int> offsetArg;
  
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&osfile,"Convert image to Game Boy sprite or background data","");
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &imageArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageArg,"0.1","");
  TCLAP::CmdLine::CmdLine(&cmd,(string *)&osfile,' ',(string *)&imageArg,true);
  if (imageArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"imgtogb","");
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &imageArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&imageArg,"Simon Larsen <simonhffh@gmail.com>","");
  imgtogb::StdOutput::StdOutput(&std_output,(string *)&osfile,(string *)&imageArg);
  if (imageArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  if ((cmd._userSetOutput == false) && (cmd._output != (CmdLineOutput *)0x0)) {
    (*(cmd._output)->_vptr_CmdLineOutput[1])();
  }
  cmd._userSetOutput = true;
  _osfile = (pointer)local_818;
  cmd._output = &std_output.super_CmdLineOutput;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"O","");
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &imageArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageArg,"offset","");
  psVar2 = &outputArg.
            super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_Arg._flag._M_string_length;
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputArg,"Tile map offset.","");
  psVar3 = &mapSwitch.super_Arg._flag._M_string_length;
  mapSwitch.super_Arg._vptr_Arg = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mapSwitch,"offset","");
  TCLAP::ValueArg<int>::ValueArg
            (&offsetArg,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,false,0,
             (string *)&mapSwitch,&cmd.super_CmdLineInterface,(Visitor *)0x0);
  if (mapSwitch.super_Arg._vptr_Arg != (_func_int **)psVar3) {
    operator_delete(mapSwitch.super_Arg._vptr_Arg);
  }
  if (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (imageArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"");
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &imageArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageArg,"map","");
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputArg,"Produce tile map","");
  local_97c = argc;
  TCLAP::Arg::Arg(&mapSwitch.super_Arg,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,
                  false,false,(Visitor *)0x0);
  mapSwitch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001566e8;
  mapSwitch.super_Arg._163_2_ = 0;
  if (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (imageArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"");
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &imageArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageArg,"sprite","");
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputArg,"Produce sprite tiles","");
  TCLAP::Arg::Arg(&spriteSwitch.super_Arg,(string *)&osfile,(string *)&imageArg,(string *)&outputArg
                  ,false,false,(Visitor *)0x0);
  spriteSwitch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001566e8;
  spriteSwitch.super_Arg._163_2_ = 0;
  if (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (imageArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)0x0;
  iStack_820._M_current = (Arg **)0x0;
  local_818[0]._M_allocated_capacity = (Arg **)0x0;
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&mapSwitch.super_Arg;
  std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
            ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&osfile,(iterator)0x0,
             (Arg **)&imageArg);
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&spriteSwitch.super_Arg;
  if (iStack_820._M_current == (Arg **)local_818[0]._0_8_) {
    std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>::_M_realloc_insert<TCLAP::Arg*>
              ((vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>> *)&osfile,iStack_820,
               (Arg **)&imageArg);
  }
  else {
    *iStack_820._M_current = &spriteSwitch.super_Arg;
    iStack_820._M_current = iStack_820._M_current + 1;
  }
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[5])(&cmd,&osfile);
  if (_osfile != (pointer)0x0) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"");
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &imageArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageArg,"8x16","");
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&outputArg,"Enable 8x16 sprite mode.","");
  TCLAP::Arg::Arg(&size8x16Switch.super_Arg,(string *)&osfile,(string *)&imageArg,
                  (string *)&outputArg,false,false,(Visitor *)0x0);
  size8x16Switch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001566e8;
  size8x16Switch.super_Arg._163_2_ = 0;
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])();
  if (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (imageArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"r","");
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg =
       (_func_int **)
       &imageArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._flag._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageArg,"rle","");
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&outputArg,"Compress data using RLE.","");
  TCLAP::Arg::Arg(&rleSwitch.super_Arg,(string *)&osfile,(string *)&imageArg,(string *)&outputArg,
                  false,false,(Visitor *)0x0);
  rleSwitch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_001566e8;
  rleSwitch.super_Arg._163_2_ = 0;
  (*cmd.super_CmdLineInterface._vptr_CmdLineInterface[3])(&cmd);
  uVar11 = local_97c;
  if (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg != (_func_int **)psVar2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if (imageArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"image","");
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputArg,"Image file path","");
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"");
  ppbVar16 = &args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&args,"IMAGE","");
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&imageArg,(string *)&osfile,(string *)&outputArg,true,&local_4f0,
                      (string *)&args,&cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
    operator_delete(args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  if (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._vptr_Arg !=
      (_func_int **)
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag._M_string_length) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._vptr_Arg);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  _osfile = (pointer)local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)&osfile,"output","");
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&args,"Output file path","");
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"");
  img._0_8_ = &img._is_shared;
  std::__cxx11::string::_M_construct<char_const*>((string *)&img,"OUTPUT","");
  TCLAP::
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::UnlabeledValueArg(&outputArg,(string *)&osfile,(string *)&args,true,&local_510,(string *)&img,
                      &cmd.super_CmdLineInterface,false,(Visitor *)0x0);
  if ((bool *)img._0_8_ != &img._is_shared) {
    operator_delete((void *)img._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
    operator_delete(args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_osfile != local_818) {
    operator_delete(_osfile);
  }
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)uVar11) {
    uVar17 = 0;
    do {
      std::__cxx11::string::string((string *)&osfile,argv[uVar17],(allocator *)&img);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&osfile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_osfile != local_818) {
        operator_delete(_osfile);
      }
      uVar17 = uVar17 + 1;
    } while (uVar11 != uVar17);
  }
  TCLAP::CmdLine::parse(&cmd,&args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  if (-1 < (int)offsetArg.super_Arg._164_4_) {
    img._data = (uchar *)0x0;
    img._width = 0;
    img._height = 0;
    img._depth = 0;
    img._spectrum = 0;
    img._is_shared = false;
    cimg_library::CImg<unsigned_char>::load
              (&img,imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._value._M_dataplus._M_p);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    if ((outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._alreadySet == true) &&
       (outputArg.
        super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super_Arg._xorSet == false)) {
      basename((char *)&osfile);
      std::__cxx11::string::operator=((string *)&name,(string *)&osfile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_osfile == local_818) goto LAB_00110acd;
    }
    else {
      basename((char *)&osfile);
      std::__cxx11::string::operator=((string *)&name,(string *)&osfile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_osfile == local_818) goto LAB_00110acd;
    }
    operator_delete(_osfile);
LAB_00110acd:
    Input = &outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value;
    std::locale::locale((locale *)local_a78);
    std::locale::locale((locale *)&args,(locale *)local_a78);
    sVar13 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_string_length;
    _Var12 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_dataplus;
    std::locale::locale((locale *)&osfile,(locale *)&args);
    lVar18 = 0;
    do {
      if ((-lVar18 == sVar13) || (lVar18 == -2)) {
        std::locale::~locale((locale *)&osfile);
        std::locale::~locale((locale *)&args);
        if (lVar18 != -2) goto LAB_00110b7d;
        std::locale::~locale((locale *)local_a78);
        goto LAB_00110f0b;
      }
      bVar14 = boost::algorithm::is_iequal::operator()
                         ((is_iequal *)&osfile,_Var12._M_p + lVar18 + (sVar13 - 1),".h" + lVar18 + 1
                         );
      lVar18 = lVar18 + -1;
    } while (bVar14);
    std::locale::~locale((locale *)&osfile);
    std::locale::~locale((locale *)&args);
LAB_00110b7d:
    std::locale::locale((locale *)local_a58._M_local_buf);
    std::locale::locale((locale *)&args,(locale *)local_a58._M_local_buf);
    sVar13 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_string_length;
    _Var12 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_dataplus;
    std::locale::locale((locale *)&osfile,(locale *)&args);
    lVar18 = 0;
    do {
      if ((-lVar18 == sVar13) || (lVar18 == -2)) {
        std::locale::~locale((locale *)&osfile);
        std::locale::~locale((locale *)&args);
        std::locale::~locale((locale *)local_a58._M_local_buf);
        std::locale::~locale((locale *)local_a78);
        if (lVar18 == -2) goto LAB_00110f0b;
        goto LAB_00110c54;
      }
      bVar14 = boost::algorithm::is_iequal::operator()
                         ((is_iequal *)&osfile,_Var12._M_p + lVar18 + (sVar13 - 1),".c" + lVar18 + 1
                         );
      lVar18 = lVar18 + -1;
    } while (bVar14);
    std::locale::~locale((locale *)&osfile);
    std::locale::~locale((locale *)&args);
    std::locale::~locale((locale *)local_a58._M_local_buf);
    std::locale::~locale((locale *)local_a78);
LAB_00110c54:
    std::locale::locale((locale *)local_a78);
    std::locale::locale((locale *)&args,(locale *)local_a78);
    sVar13 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_string_length;
    _Var12 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_dataplus;
    std::locale::locale((locale *)&osfile,(locale *)&args);
    lVar18 = 0;
    do {
      if ((-lVar18 == sVar13) || (lVar18 == -4)) {
        std::locale::~locale((locale *)&osfile);
        std::locale::~locale((locale *)&args);
        if (lVar18 == -4) goto LAB_001110e8;
        goto LAB_00110d06;
      }
      bVar14 = boost::algorithm::is_iequal::operator()
                         ((is_iequal *)&osfile,_Var12._M_p + lVar18 + (sVar13 - 1),
                          ".asm" + lVar18 + 3);
      lVar18 = lVar18 + -1;
    } while (bVar14);
    std::locale::~locale((locale *)&osfile);
    std::locale::~locale((locale *)&args);
LAB_00110d06:
    std::locale::locale((locale *)local_a58._M_local_buf);
    std::locale::locale((locale *)&args,(locale *)local_a58._M_local_buf);
    sVar13 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_string_length;
    _Var12 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_dataplus;
    std::locale::locale((locale *)&osfile,(locale *)&args);
    lVar18 = 0;
    do {
      if ((-lVar18 == sVar13) || (lVar18 == -2)) {
        std::locale::~locale((locale *)&osfile);
        std::locale::~locale((locale *)&args);
        if (lVar18 == -2) goto LAB_001110de;
        goto LAB_00110db9;
      }
      bVar14 = boost::algorithm::is_iequal::operator()
                         ((is_iequal *)&osfile,_Var12._M_p + lVar18 + (sVar13 - 1),".s" + lVar18 + 1
                         );
      lVar18 = lVar18 + -1;
    } while (bVar14);
    std::locale::~locale((locale *)&osfile);
    std::locale::~locale((locale *)&args);
LAB_00110db9:
    std::locale::locale((locale *)&local_a38);
    std::locale::locale((locale *)&args,(locale *)&local_a38);
    sVar13 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_string_length;
    _Var12 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_dataplus;
    std::locale::locale((locale *)&osfile,(locale *)&args);
    lVar18 = 0;
    do {
      if ((-lVar18 == sVar13) || (lVar18 == -6)) {
        std::locale::~locale((locale *)&osfile);
        std::locale::~locale((locale *)&args);
        if (lVar18 == -6) goto LAB_001110d4;
        goto LAB_00110e6d;
      }
      bVar14 = boost::algorithm::is_iequal::operator()
                         ((is_iequal *)&osfile,_Var12._M_p + lVar18 + (sVar13 - 1),
                          ".gbz80" + lVar18 + 5);
      lVar18 = lVar18 + -1;
    } while (bVar14);
    std::locale::~locale((locale *)&osfile);
    std::locale::~locale((locale *)&args);
LAB_00110e6d:
    std::locale::locale((locale *)&local_998);
    std::locale::locale((locale *)&args,(locale *)&local_998);
    _Var12 = outputArg.
             super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._value._M_dataplus;
    std::locale::locale((locale *)&osfile,(locale *)&args);
    lVar18 = 0;
LAB_00110ec4:
    if ((-lVar18 !=
         outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._value._M_string_length) && (lVar18 != -4)) goto code_r0x00110ecf;
    std::locale::~locale((locale *)&osfile);
    std::locale::~locale((locale *)&args);
    if (lVar18 == -4) {
      std::locale::~locale((locale *)&local_998);
LAB_001110d4:
      std::locale::~locale((locale *)&local_a38);
LAB_001110de:
      std::locale::~locale((locale *)local_a58._M_local_buf);
LAB_001110e8:
      std::locale::~locale((locale *)local_a78);
      bVar14 = false;
      goto LAB_001110f7;
    }
    goto LAB_00110f34;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error: Tile map offset must be non-negative.",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  iVar15 = 1;
  std::ostream::flush();
  goto LAB_00111505;
code_r0x00110ecf:
  bVar14 = boost::algorithm::is_iequal::operator()
                     ((is_iequal *)&osfile,
                      _Var12._M_p +
                      lVar18 + (outputArg.
                                super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._value._M_string_length - 1),".z80" + lVar18 + 3);
  lVar18 = lVar18 + -1;
  if (!bVar14) goto code_r0x00110eea;
  goto LAB_00110ec4;
LAB_00110f0b:
  bVar14 = true;
LAB_001110f7:
  ppbVar16 = &args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::ofstream::ofstream((string *)&osfile);
  os = (ostream *)&std::cout;
  if ((outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._alreadySet == true) &&
     (outputArg.
      super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super_Arg._xorSet == false)) {
    std::ofstream::open((string *)&osfile,(_Ios_Openmode)Input);
    os = (ostream *)&osfile;
  }
  if (mapSwitch.super_Arg._163_1_ == '\x01') {
    imgtogb::Tilemap::Tilemap((Tilemap *)&args,&img,offsetArg.super_Arg._164_4_);
    local_a58._M_allocated_capacity = 0;
    local_a58._8_8_ = (pointer)0x0;
    local_a48 = (pointer)0x0;
    local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    imgtogb::Tilemap::getTileMap
              ((Tilemap *)&args,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a58)
    ;
    imgtogb::Tilemap::getTileData((Tilemap *)&args,&local_a38);
    if (rleSwitch.super_Arg._163_1_ == '\x01') {
      local_a78._0_8_ = (pointer)0x0;
      local_a78._8_8_ = (pointer)0x0;
      local_a78._16_8_ = (pointer)0x0;
      local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a58,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a78);
      imgtogb::rle_encode(&local_a38,&local_998);
      puVar10 = local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar9 = local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar8 = local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar7 = local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar1 = local_a48;
      uVar5 = local_a58._8_8_;
      uVar4 = local_a78._0_8_;
      local_a78._0_8_ = local_a58._M_allocated_capacity;
      local_a58._M_allocated_capacity = uVar4;
      local_a58._8_8_ = local_a78._8_8_;
      local_a48 = (pointer)local_a78._16_8_;
      local_a78._8_8_ = uVar5;
      local_a78._16_8_ = pbVar1;
      local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar10;
      local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
      local_998.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar9;
      if (puVar7 != (pointer)0x0) {
        operator_delete(puVar7);
      }
      if ((pointer)local_a78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a78._0_8_);
      }
    }
    if (bVar14) {
      tiledata_size = imgtogb::Tilemap::getTileDataSize((Tilemap *)&args);
      tiles_x = imgtogb::Tilemap::getTilesX((Tilemap *)&args);
      tiles_y = imgtogb::Tilemap::getTilesY((Tilemap *)&args);
      emitMapCHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a58,
                     tiledata_size,tiles_x,tiles_y,offsetArg.super_Arg._164_4_,&local_a38,&name,os);
    }
    else {
      pbVar1 = (pointer)(local_a78 + 0x10);
      local_a78._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a78,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append(local_a78);
      emitASMArray(&local_a38,(string *)local_a78,os);
      if ((pointer)local_a78._0_8_ != pbVar1) {
        operator_delete((void *)local_a78._0_8_);
      }
      local_a78._0_8_ = pbVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a78,name._M_dataplus._M_p,
                 name._M_dataplus._M_p + name._M_string_length);
      std::__cxx11::string::append(local_a78);
      emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a58,
                   (string *)local_a78,os);
      if ((pointer)local_a78._0_8_ != pbVar1) {
        operator_delete((void *)local_a78._0_8_);
      }
    }
    if (local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_a58._M_allocated_capacity != (pointer)0x0) {
      operator_delete((void *)local_a58._M_allocated_capacity);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
    ::~_Rb_tree(&local_9c8);
    if (local_9d8 != 0) {
LAB_00111490:
      operator_delete(local_9d0);
    }
  }
  else {
    local_a78._0_8_ = (pointer)0x0;
    local_a78._8_8_ = (pointer)0x0;
    local_a78._16_8_ = (pointer)0x0;
    produceSpriteData(&img,(bool)size8x16Switch.super_Arg._163_1_,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a78);
    uVar17 = local_a78._8_8_ - local_a78._0_8_;
    if (rleSwitch.super_Arg._163_1_ == '\x01') {
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      imgtogb::rle_encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a78,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&args);
      pbVar1 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = local_a78._16_8_;
      uVar5 = local_a78._8_8_;
      uVar4 = local_a78._0_8_;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a78._0_8_;
      local_a78._0_8_ = pbVar1;
      local_a78._8_8_ =
           args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a78._16_8_ =
           args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar5;
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar6;
      if ((pointer)uVar4 != (pointer)0x0) {
        operator_delete((void *)uVar4);
      }
    }
    if (bVar14) {
      emitSpriteCHeader((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a78,
                        uVar17 >> 4,&name,os);
    }
    else {
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&args,name._M_dataplus._M_p,name._M_dataplus._M_p + name._M_string_length
                );
      std::__cxx11::string::append((char *)&args);
      emitASMArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a78,
                   (string *)&args,os);
      if (args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
        operator_delete(args.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_9d0 = (pointer)local_a78._0_8_;
    if ((pointer)local_a78._0_8_ != (pointer)0x0) goto LAB_00111490;
  }
  _osfile = (pointer)_VTT;
  *(undefined8 *)(&osfile + *(long *)(_VTT->_M_local_buf + -0x18)) = _stdin;
  std::filebuf::~filebuf((filebuf *)&iStack_820);
  std::ios_base::~ios_base(local_730);
  iVar15 = 0;
  goto LAB_001114cf;
code_r0x00110eea:
  std::locale::~locale((locale *)&osfile);
  std::locale::~locale((locale *)&args);
LAB_00110f34:
  std::locale::locale((locale *)&osfile);
  bVar14 = boost::algorithm::iends_with<std::__cxx11::string,char[5]>
                     (Input,(char (*) [5])0x145529,(locale *)&osfile);
  std::locale::~locale((locale *)&osfile);
  std::locale::~locale((locale *)&local_998);
  std::locale::~locale((locale *)&local_a38);
  std::locale::~locale((locale *)local_a58._M_local_buf);
  std::locale::~locale((locale *)local_a78);
  if (bVar14) {
    bVar14 = false;
    goto LAB_001110f7;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error: Unknown file ending for output file",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Known types:",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\tC: .c, .asm ",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\tRGBDS: .asm, .s, .gbz80, .z80, .inc",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  std::ostream::put(-0x30);
  iVar15 = 1;
  std::ostream::flush();
LAB_001114cf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  if ((img._is_shared == false) && (img._data != (uchar *)0x0)) {
    operator_delete__(img._data);
  }
LAB_00111505:
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_001569c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._typeDesc._M_dataplus._M_p !=
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._typeDesc.field_2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._default._M_dataplus._M_p !=
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._default.field_2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._value._M_dataplus._M_p !=
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._value.field_2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._value._M_dataplus._M_p);
  }
  outputArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00156590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._requireLabel._M_dataplus._M_p !=
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._requireLabel.field_2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._description._M_dataplus._M_p !=
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._description.field_2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._name._M_dataplus._M_p !=
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._name.field_2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._flag._M_dataplus._M_p !=
      &outputArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag.field_2) {
    operator_delete(outputArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._flag._M_dataplus._M_p);
  }
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_001569c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._typeDesc._M_dataplus._M_p !=
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._typeDesc.field_2) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._typeDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._default._M_dataplus._M_p !=
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._default.field_2) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._default._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._value._M_dataplus._M_p !=
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._value.field_2) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._value._M_dataplus._M_p);
  }
  imageArg.
  super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00156590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._requireLabel._M_dataplus._M_p !=
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._requireLabel.field_2) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._description._M_dataplus._M_p !=
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._description.field_2) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._name._M_dataplus._M_p !=
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._name.field_2) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageArg.
         super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super_Arg._flag._M_dataplus._M_p !=
      &imageArg.
       super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super_Arg._flag.field_2) {
    operator_delete(imageArg.
                    super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super_Arg._flag._M_dataplus._M_p);
  }
  rleSwitch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00156590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rleSwitch.super_Arg._requireLabel._M_dataplus._M_p !=
      &rleSwitch.super_Arg._requireLabel.field_2) {
    operator_delete(rleSwitch.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rleSwitch.super_Arg._description._M_dataplus._M_p !=
      &rleSwitch.super_Arg._description.field_2) {
    operator_delete(rleSwitch.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rleSwitch.super_Arg._name._M_dataplus._M_p != &rleSwitch.super_Arg._name.field_2) {
    operator_delete(rleSwitch.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rleSwitch.super_Arg._flag._M_dataplus._M_p != &rleSwitch.super_Arg._flag.field_2) {
    operator_delete(rleSwitch.super_Arg._flag._M_dataplus._M_p);
  }
  size8x16Switch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00156590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)size8x16Switch.super_Arg._requireLabel._M_dataplus._M_p !=
      &size8x16Switch.super_Arg._requireLabel.field_2) {
    operator_delete(size8x16Switch.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)size8x16Switch.super_Arg._description._M_dataplus._M_p !=
      &size8x16Switch.super_Arg._description.field_2) {
    operator_delete(size8x16Switch.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)size8x16Switch.super_Arg._name._M_dataplus._M_p != &size8x16Switch.super_Arg._name.field_2)
  {
    operator_delete(size8x16Switch.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)size8x16Switch.super_Arg._flag._M_dataplus._M_p != &size8x16Switch.super_Arg._flag.field_2)
  {
    operator_delete(size8x16Switch.super_Arg._flag._M_dataplus._M_p);
  }
  spriteSwitch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00156590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)spriteSwitch.super_Arg._requireLabel._M_dataplus._M_p !=
      &spriteSwitch.super_Arg._requireLabel.field_2) {
    operator_delete(spriteSwitch.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)spriteSwitch.super_Arg._description._M_dataplus._M_p !=
      &spriteSwitch.super_Arg._description.field_2) {
    operator_delete(spriteSwitch.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)spriteSwitch.super_Arg._name._M_dataplus._M_p != &spriteSwitch.super_Arg._name.field_2) {
    operator_delete(spriteSwitch.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)spriteSwitch.super_Arg._flag._M_dataplus._M_p != &spriteSwitch.super_Arg._flag.field_2) {
    operator_delete(spriteSwitch.super_Arg._flag._M_dataplus._M_p);
  }
  mapSwitch.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00156590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mapSwitch.super_Arg._requireLabel._M_dataplus._M_p !=
      &mapSwitch.super_Arg._requireLabel.field_2) {
    operator_delete(mapSwitch.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mapSwitch.super_Arg._description._M_dataplus._M_p !=
      &mapSwitch.super_Arg._description.field_2) {
    operator_delete(mapSwitch.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mapSwitch.super_Arg._name._M_dataplus._M_p != &mapSwitch.super_Arg._name.field_2) {
    operator_delete(mapSwitch.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mapSwitch.super_Arg._flag._M_dataplus._M_p != &mapSwitch.super_Arg._flag.field_2) {
    operator_delete(mapSwitch.super_Arg._flag._M_dataplus._M_p);
  }
  offsetArg.super_Arg._vptr_Arg = (_func_int **)&PTR__ValueArg_00156aa0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsetArg._typeDesc._M_dataplus._M_p != &offsetArg._typeDesc.field_2) {
    operator_delete(offsetArg._typeDesc._M_dataplus._M_p);
  }
  offsetArg.super_Arg._vptr_Arg = (_func_int **)&PTR__Arg_00156590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsetArg.super_Arg._requireLabel._M_dataplus._M_p !=
      &offsetArg.super_Arg._requireLabel.field_2) {
    operator_delete(offsetArg.super_Arg._requireLabel._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsetArg.super_Arg._description._M_dataplus._M_p !=
      &offsetArg.super_Arg._description.field_2) {
    operator_delete(offsetArg.super_Arg._description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsetArg.super_Arg._name._M_dataplus._M_p != &offsetArg.super_Arg._name.field_2) {
    operator_delete(offsetArg.super_Arg._name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)offsetArg.super_Arg._flag._M_dataplus._M_p != &offsetArg.super_Arg._flag.field_2) {
    operator_delete(offsetArg.super_Arg._flag._M_dataplus._M_p);
  }
  std_output.super_CmdLineOutput._vptr_CmdLineOutput = (_func_int **)&PTR__StdOutput_00156808;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)std_output.author._M_dataplus._M_p != &std_output.author.field_2) {
    operator_delete(std_output.author._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)std_output.basename._M_dataplus._M_p != &std_output.basename.field_2) {
    operator_delete(std_output.basename._M_dataplus._M_p);
  }
  TCLAP::CmdLine::~CmdLine(&cmd);
  return iVar15;
}

Assistant:

int main(int argc, const char *argv[]) {
	TCLAP::CmdLine cmd("Convert image to Game Boy sprite or background data",' ',"0.1");
	imgtogb::StdOutput std_output("imgtogb", "Simon Larsen <simonhffh@gmail.com>");
	cmd.setOutput(&std_output);

	TCLAP::ValueArg<int> offsetArg("O", "offset", "Tile map offset.", false, 0, "offset", cmd);
	TCLAP::SwitchArg mapSwitch("", "map", "Produce tile map", false);
	TCLAP::SwitchArg spriteSwitch("", "sprite", "Produce sprite tiles", false);
	cmd.xorAdd(mapSwitch, spriteSwitch);
	TCLAP::SwitchArg size8x16Switch("", "8x16", "Enable 8x16 sprite mode.", cmd);
	TCLAP::SwitchArg rleSwitch("r", "rle", "Compress data using RLE.", cmd);
	TCLAP::UnlabeledValueArg<std::string> imageArg("image", "Image file path", true, "", "IMAGE", cmd);
	TCLAP::UnlabeledValueArg<std::string> outputArg("output", "Output file path", true, "", "OUTPUT", cmd);

	cmd.parse(argc, argv);

	if(offsetArg.getValue() < 0) {
		std::cerr << "error: Tile map offset must be non-negative." << std::endl;
		return 1;
	}

	Image img(imageArg.getValue().c_str());

	// Get basename
	std::string name;
	if(outputArg.isSet()) {
		name = basename(outputArg.getValue());
	} else {
		name = basename(imageArg.getValue());
	}

	// Determine output file ending
	Target target;
	if(boost::algorithm::iends_with(outputArg.getValue(), ".h")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".c")) {
		target = Target::C;
	}
	else if(boost::algorithm::iends_with(outputArg.getValue(), ".asm")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".s")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".gbz80")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".z80")
	|| boost::algorithm::iends_with(outputArg.getValue(), ".inc")) {
		target = Target::ASM;
	}
	else {
		std::cerr << "error: Unknown file ending for output file" << std::endl;
		std::cerr << "Known types:" << std::endl;
		std::cerr << "\tC: .c, .asm " << std::endl;
		std::cerr << "\tRGBDS: .asm, .s, .gbz80, .z80, .inc" << std::endl;
		return 1;
	}

	// Get output stream
	std::ofstream osfile;
	std::ostream &output_stream = outputArg.isSet()
		? osfile.open(outputArg.getValue()), osfile
		: std::cout;

	// Output tile map
	if(mapSwitch.getValue()) {
		Tilemap map(img, offsetArg.getValue());
		std::vector<unsigned char> tilemap, tiledata;
		map.getTileMap(tilemap);
		map.getTileData(tiledata);
		if(rleSwitch.getValue()) {
			std::vector<unsigned char> tilemap_rle, tiledata_rle;
			rle_encode(tilemap, tilemap_rle);
			rle_encode(tiledata, tiledata_rle);
			tilemap.swap(tilemap_rle);
			tiledata.swap(tiledata_rle);
		}
		if(target == Target::C) {
			emitMapCHeader(tilemap, map.getTileDataSize(), map.getTilesX(), map.getTilesY(), offsetArg.getValue(), tiledata, name, output_stream);
		} else if(target == Target::ASM) {
			emitASMArray(tiledata, name+"_data", output_stream);
			emitASMArray(tilemap, name+"_tiles", output_stream);
		}
	}
	// Output sprite data
	else {
		std::vector<unsigned char> data;
		produceSpriteData(img, size8x16Switch.getValue(), data);
		size_t data_length = data.size() / 16;
		if(rleSwitch.getValue()) {
			std::vector<unsigned char> data_rle;
			rle_encode(data, data_rle);
			data.swap(data_rle);
		}
		if(target == Target::C) {
			emitSpriteCHeader(data, data_length, name, output_stream);
		} else if(target == Target::ASM) {
			emitASMArray(data, name+"_data", output_stream);
		}
	}

	return 0;
}